

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

FindInfo __thiscall
absl::lts_20250127::container_internal::find_first_non_full<void>
          (container_internal *this,CommonFields *common,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long *in_FS_OFFSET;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar25;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar21 = uVar3 >> 0xc;
  uVar19 = (ulong)common >> 7;
  uVar20 = (uVar21 ^ uVar19) & uVar2;
  if (*(char *)(uVar3 + uVar20) < -1) {
    if (0xe < uVar2) {
      lVar4 = in_FS_OFFSET[-6];
      in_FS_OFFSET[-6] = lVar4 + 1U;
      uVar18 = lVar4 + 1U ^ uVar21 ^ *in_FS_OFFSET - 0x30U ^ uVar19;
      hash = uVar18 / 0xd;
      if (6 < uVar18 % 0xd) goto LAB_010588db;
    }
    hash = 0;
    uVar18 = uVar20;
  }
  else {
LAB_010588db:
    uVar18 = *in_FS_OFFSET - 0x30;
    uVar19 = uVar19 ^ uVar18;
    uVar22 = in_FS_OFFSET[-6];
    uVar23 = 0;
    do {
      pcVar1 = (char *)(uVar3 + uVar20);
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar1 < (char)iVar9);
      in_XMM1_Bb = -(pcVar1[1] < (char)((uint)iVar9 >> 8));
      in_XMM1_Bc = -(pcVar1[2] < (char)((uint)iVar9 >> 0x10));
      in_XMM1_Bd = -(pcVar1[3] < (char)((uint)iVar9 >> 0x18));
      in_XMM1_Be = -(pcVar1[4] < (char)iVar10);
      in_XMM1_Bf = -(pcVar1[5] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bg = -(pcVar1[6] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bh = -(pcVar1[7] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Bi = -(pcVar1[8] < (char)iVar11);
      in_XMM1_Bj = -(pcVar1[9] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bk = -(pcVar1[10] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bl = -(pcVar1[0xb] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bm = -(pcVar1[0xc] < (char)iVar12);
      in_XMM1_Bn = -(pcVar1[0xd] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bo = -(pcVar1[0xe] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bp = -(pcVar1[0xf] < (char)((uint)iVar12 >> 0x18));
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bd;
      auVar16[0] = in_XMM1_Bc;
      auVar16[2] = in_XMM1_Be;
      auVar16[3] = in_XMM1_Bf;
      auVar16[4] = in_XMM1_Bg;
      auVar16[5] = in_XMM1_Bh;
      auVar16[6] = in_XMM1_Bi;
      auVar16[7] = in_XMM1_Bj;
      auVar16[8] = in_XMM1_Bk;
      auVar16[9] = in_XMM1_Bl;
      auVar16[10] = in_XMM1_Bm;
      auVar16[0xb] = in_XMM1_Bn;
      auVar16[0xc] = in_XMM1_Bo;
      auVar16[0xd] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Be;
      auVar15[0] = in_XMM1_Bd;
      auVar15[2] = in_XMM1_Bf;
      auVar15[3] = in_XMM1_Bg;
      auVar15[4] = in_XMM1_Bh;
      auVar15[5] = in_XMM1_Bi;
      auVar15[6] = in_XMM1_Bj;
      auVar15[7] = in_XMM1_Bk;
      auVar15[8] = in_XMM1_Bl;
      auVar15[9] = in_XMM1_Bm;
      auVar15[10] = in_XMM1_Bn;
      auVar15[0xb] = in_XMM1_Bo;
      auVar15[0xc] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bf;
      auVar14[0] = in_XMM1_Be;
      auVar14[2] = in_XMM1_Bg;
      auVar14[3] = in_XMM1_Bh;
      auVar14[4] = in_XMM1_Bi;
      auVar14[5] = in_XMM1_Bj;
      auVar14[6] = in_XMM1_Bk;
      auVar14[7] = in_XMM1_Bl;
      auVar14[8] = in_XMM1_Bm;
      auVar14[9] = in_XMM1_Bn;
      auVar14[10] = in_XMM1_Bo;
      auVar14[0xb] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bg;
      auVar13[0] = in_XMM1_Bf;
      auVar13[2] = in_XMM1_Bh;
      auVar13[3] = in_XMM1_Bi;
      auVar13[4] = in_XMM1_Bj;
      auVar13[5] = in_XMM1_Bk;
      auVar13[6] = in_XMM1_Bl;
      auVar13[7] = in_XMM1_Bm;
      auVar13[8] = in_XMM1_Bn;
      auVar13[9] = in_XMM1_Bo;
      auVar13[10] = in_XMM1_Bp;
      uVar6 = (ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3
              | (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
              (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
              (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                       CONCAT18(in_XMM1_Bo,
                                                CONCAT17(in_XMM1_Bn,
                                                         CONCAT16(in_XMM1_Bm,
                                                                  CONCAT15(in_XMM1_Bl,
                                                                           CONCAT14(in_XMM1_Bk,
                                                                                    CONCAT13(
                                                  in_XMM1_Bj,
                                                  CONCAT12(in_XMM1_Bi,
                                                           CONCAT11(in_XMM1_Bh,in_XMM1_Bg)))))))))
                             >> 7) & 1) << 6 |
              (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                       CONCAT17(in_XMM1_Bo,
                                                CONCAT16(in_XMM1_Bn,
                                                         CONCAT15(in_XMM1_Bm,
                                                                  CONCAT14(in_XMM1_Bl,
                                                                           CONCAT13(in_XMM1_Bk,
                                                                                    CONCAT12(
                                                  in_XMM1_Bj,CONCAT11(in_XMM1_Bi,in_XMM1_Bh))))))))
                             >> 7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf;
      if (uVar6 == 0) {
        uVar24 = uVar23 + 0x10;
        if (uVar2 < uVar24) {
          __assert_fail("(seq.index() <= common.capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x724,
                        "FindInfo absl::container_internal::find_first_non_full(const CommonFields &, size_t)"
                       );
        }
        uVar20 = uVar20 + uVar23 + 0x10 & uVar2;
      }
      else {
        if (uVar2 < 0xf) {
LAB_01058969:
          uVar17 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
        }
        else {
          uVar22 = uVar22 + 1;
          in_FS_OFFSET[-6] = uVar22;
          if ((uVar19 ^ uVar21 ^ uVar22) % 0xd < 7) goto LAB_01058969;
          uVar5 = 0xf;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar17 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
        }
        uVar18 = uVar17 + uVar20 & uVar2;
        hash = uVar23;
        uVar24 = uVar23;
      }
      uVar23 = uVar24;
    } while (uVar6 == 0);
  }
  FVar25.probe_length = hash;
  FVar25.offset = uVar18;
  return FVar25;
}

Assistant:

size_t capacity() const { return capacity_; }